

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<void_(henson::ChaiScheduler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/src/chai/scheduler.cpp:25:21)>
::do_call(Proxy_Function_Callable_Impl<void_(henson::ChaiScheduler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>,_int),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_scheduler_cpp:25:21)>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  _Rb_tree_node_base *__args;
  _Rb_tree_header *p_Var1;
  _Base_ptr __n;
  pointer pbVar2;
  Proxy_Function_Callable_Impl<void_(henson::ChaiScheduler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>,_int),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_scheduler_cpp:25:21)>
  *pPVar3;
  Result_Type RVar4;
  Result_Type RVar5;
  Result_Type pCVar6;
  _Base_ptr p_Var7;
  pointer pTVar8;
  Type_Conversions_State *in_RCX;
  Type_Conversions_State *t_conversions_00;
  ulong uVar9;
  int *__args_1;
  int iVar10;
  Boxed_Value BVar11;
  int leftover_group_size;
  int sz;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unspecified;
  Vector groups_vector;
  int local_19c;
  undefined1 local_198 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  MemoryBuffer local_160;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_138;
  Proxy_Function_Callable_Impl<void_(henson::ChaiScheduler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>,_int),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_scheduler_cpp:25:21)>
  *local_118;
  Result_Type local_110;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *local_108;
  long local_100;
  chaiscript local_f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  Result_Type local_e4;
  Result_Type local_e0;
  Result_Type local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_80;
  size_t local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  local_60;
  
  t_conversions_00 = in_RCX;
  pCVar6 = boxed_cast<henson::ChaiScheduler*>
                     ((Boxed_Value *)(t_conversions->m_conversions)._M_data,in_RCX);
  boxed_cast<std::__cxx11::string>
            (&local_c0,
             (chaiscript *)
             ((((t_conversions->m_conversions)._M_data)->m_mutex).super_mutex.super___mutex_base.
              _M_mutex.__size + 0x10),(Boxed_Value *)in_RCX,t_conversions_00);
  boxed_cast<std::__cxx11::string>
            (&local_e0,
             (chaiscript *)
             &(((t_conversions->m_conversions)._M_data)->m_mutex).super_mutex.super___mutex_base.
              _M_mutex.__data.__list.__next,(Boxed_Value *)in_RCX,t_conversions_00);
  boxed_cast<chaiscript::Boxed_Value>
            (local_f8,(Boxed_Value *)
                      &(((t_conversions->m_conversions)._M_data)->m_conversions)._M_t._M_impl.
                       super__Rb_tree_header,in_RCX);
  boxed_cast<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            ((Result_Type *)&local_60,
             (chaiscript *)
             &(((t_conversions->m_conversions)._M_data)->m_conversions)._M_t._M_impl.
              super__Rb_tree_header._M_header._M_left,(Boxed_Value *)in_RCX,t_conversions_00);
  local_108 = params;
  RVar4 = boxed_cast<int>((Boxed_Value *)
                          &(((t_conversions->m_conversions)._M_data)->m_conversions)._M_t._M_impl.
                           super__Rb_tree_header._M_node_count,in_RCX);
  iVar10 = 0;
  local_138.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_118 = this;
  local_110 = pCVar6;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
    uVar9 = 0;
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    iVar10 = 0;
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      RVar5 = boxed_cast<int>((Boxed_Value *)(p_Var7 + 2),(Type_Conversions_State *)0x0);
      if (RVar5 < 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_178,(value_type *)(p_Var7 + 1));
      }
      else {
        iVar10 = iVar10 + RVar5;
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    uVar9 = (long)local_178.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_178.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  local_19c = (int)((ulong)(long)RVar4 / uVar9);
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    local_100 = (long)(RVar4 - iVar10);
    do {
      RVar5 = boxed_cast<int>((Boxed_Value *)(p_Var7 + 2),(Type_Conversions_State *)0x0);
      pbVar2 = local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __args = p_Var7 + 1;
      local_198._0_4_ = RVar5;
      __args_1 = (int *)local_198;
      if (RVar5 < 1) {
        __n = p_Var7[1]._M_parent;
        __args_1 = &local_19c;
        if (__n != (_Base_ptr)
                   local_178.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length)
        goto LAB_001dc399;
        if (__n != (_Base_ptr)0x0) {
          iVar10 = bcmp(*(void **)__args,
                        local_178.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p,(size_t)__n)
          ;
          __args_1 = &local_19c;
          if (iVar10 != 0) goto LAB_001dc399;
        }
        local_160.super_BinaryBuffer._vptr_BinaryBuffer =
             (_func_int **)
             (local_100 -
             (((long)pbVar2 -
               (long)local_178.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) + -1) * (long)local_19c);
        std::
        vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
        ::emplace_back<std::__cxx11::string_const&,unsigned_long>
                  ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                    *)&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
                   (unsigned_long *)&local_160);
      }
      else {
LAB_001dc399:
        std::
        vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
        ::emplace_back<std::__cxx11::string_const&,int&>
                  ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                    *)&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
                   __args_1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  local_160.super_BinaryBuffer._vptr_BinaryBuffer = (_func_int **)&PTR_save_binary_003130c0;
  local_160.position = 0;
  local_160.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_160.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_160.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_108[2].
      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
      super__Vector_impl_data._M_finish == (pointer)0x0) {
    std::__throw_bad_function_call();
  }
  (*(code *)local_108[2].
            super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage)
            (local_198,
             &local_108[1].
              super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_f8);
  pCVar6 = local_110;
  henson::Serialization<chaiscript::Boxed_Value>::save
            (&local_160.super_BinaryBuffer,(Boxed_Value *)local_198);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
  }
  local_198._0_8_ = (element_type *)(local_198 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_198,local_c0._M_dataplus._M_p,
             local_c0._M_dataplus._M_p + local_c0._M_string_length);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_e0._M_dataplus._M_p,
             local_e0._M_dataplus._M_p + local_e0._M_string_length);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::vector(&local_80,&local_138);
  local_68 = (pCVar6->super_Scheduler).job_id_;
  (pCVar6->super_Scheduler).job_id_ = local_68 + 1;
  local_e4 = RVar4;
  std::deque<henson::Scheduler::Job,std::allocator<henson::Scheduler::Job>>::
  emplace_back<unsigned_long,std::__cxx11::string&,std::__cxx11::string&,henson::MemoryBuffer_const&,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>&,int&>
            ((deque<henson::Scheduler::Job,std::allocator<henson::Scheduler::Job>> *)
             &(pCVar6->super_Scheduler).jobs_,&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             &local_a0,&local_160,&local_80,&local_e4);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_198._0_8_ != (element_type *)(local_198 + 0x10)) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  pPVar3 = local_118;
  local_160.super_BinaryBuffer._vptr_BinaryBuffer = (_func_int **)&PTR_save_binary_003130c0;
  if (local_160.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_160.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&local_60);
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  pTVar8 = (pointer)operator_new(0x50);
  pTVar8->m_bare_type_info = (type_info *)0x100000001;
  pTVar8->m_type_info = (type_info *)&PTR___Sp_counted_ptr_inplace_0030d160;
  *(undefined **)&pTVar8->m_flags = &void::typeinfo;
  pTVar8[1].m_type_info = (type_info *)&void::typeinfo;
  *(undefined4 *)&pTVar8[1].m_bare_type_info = 8;
  *(undefined8 *)&pTVar8[1].m_flags = 0;
  pTVar8[2].m_type_info = (type_info *)0x0;
  pTVar8[2].m_bare_type_info = (type_info *)0x0;
  *(undefined8 *)&pTVar8[2].m_flags = 0;
  *(undefined2 *)&pTVar8[3].m_type_info = 0;
  (pPVar3->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base.m_types.
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_start = pTVar8;
  (pPVar3->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&pTVar8->m_flags;
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&void::typeinfo;
  BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)pPVar3;
  return (Boxed_Value)
         BVar11.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          typedef typename detail::Function_Signature<Func>::Return_Type Return_Type;
          return detail::Do_Call<Return_Type>::template go<Func>(m_f, params, t_conversions);
        }